

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O2

int sptk::snack::window(float *din,float *dout,int n,float preemp,int type,int *wsizep,float **windp
                       )

{
  switch(type) {
  case 0:
    xrwindow(din,dout,n,preemp);
    break;
  case 1:
    xhwindow(din,dout,n,preemp,wsizep,windp);
    break;
  case 2:
    xcwindow(din,dout,n,preemp,wsizep,windp);
    break;
  case 3:
    xhnwindow(din,dout,n,preemp,wsizep,windp);
    break;
  default:
    fprintf(_stderr,"Unknown window type (%d) requested in window()\n",(ulong)(uint)type);
    return 0;
  }
  return 1;
}

Assistant:

int window(float *din, float *dout, int n, float preemp, int type,
           int *wsizep, float **windp)
#endif
{
  switch(type) {
  case 0:			/* rectangular */
    xrwindow(din, dout, n, preemp);
    break;
  case 1:			/* Hamming */
#if 0
    xhwindow(din, dout, n, preemp);
#else
    xhwindow(din, dout, n, preemp, wsizep, windp);
#endif
    break;
  case 2:			/* cos^4 */
#if 0
    xcwindow(din, dout, n, preemp);
#else
    xcwindow(din, dout, n, preemp, wsizep, windp);
#endif
    break;
  case 3:			/* Hanning */
#if 0
    xhnwindow(din, dout, n, preemp);
#else
    xhnwindow(din, dout, n, preemp, wsizep, windp);
#endif
    break;
  default:
    Fprintf(stderr,"Unknown window type (%d) requested in window()\n",type);
    return(FALSE);
  }
  return(TRUE);
}